

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O3

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::EnsureSourceInfo
          (JsBuiltInEngineInterfaceExtensionObject *this)

{
  Recycler *alloc;
  SourceContextInfo *pSVar1;
  SRCINFO *pSVar2;
  undefined1 auStack_58 [8];
  TrackAllocData data;
  
  if ((this->sourceInfo).ptr != (SRCINFO *)0x0) {
    return;
  }
  auStack_58 = (undefined1  [8])&SourceContextInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_86adc74;
  data.filename = (char *)CONCAT44(data.filename._4_4_,0xf1);
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_EngineExtensionObjectBase).scriptContext.ptr)->recycler,
                     (TrackAllocData *)auStack_58);
  pSVar1 = (SourceContextInfo *)new<Memory::Recycler>(0x38,alloc,0x56b216);
  (pSVar1->sourceDynamicProfileManager).ptr = (SourceDynamicProfileManager *)0x0;
  pSVar1->dwHostSourceContext = 0xfffffffffffffffe;
  pSVar1->isHostDynamicDocument = true;
  pSVar1->sourceContextId = 0xfffffffe;
  data.filename = (char *)0x0;
  data.plusSize = 0;
  data.count = 0;
  auStack_58 = (undefined1  [8])0x0;
  data.typeinfo = (type_info *)0x0;
  Memory::Recycler::WBSetBit((char *)auStack_58);
  auStack_58 = (undefined1  [8])pSVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((SRCINFO *)auStack_58);
  pSVar2 = ScriptContext::AddHostSrcInfo
                     ((this->super_EngineExtensionObjectBase).scriptContext.ptr,
                      (SRCINFO *)auStack_58);
  Memory::Recycler::WBSetBit((char *)&this->sourceInfo);
  (this->sourceInfo).ptr = pSVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->sourceInfo);
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::EnsureSourceInfo()
    {
        if (sourceInfo == nullptr)
        {
            SourceContextInfo* sourceContextInfo = RecyclerNewStructZ(scriptContext->GetRecycler(), SourceContextInfo);
            sourceContextInfo->dwHostSourceContext = Js::Constants::JsBuiltInSourceContext;
            sourceContextInfo->isHostDynamicDocument = true;
            sourceContextInfo->sourceContextId = Js::Constants::JsBuiltInSourceContextId;

            Assert(sourceContextInfo != nullptr);

            SRCINFO si;
            memset(&si, 0, sizeof(si));
            si.sourceContextInfo = sourceContextInfo;
            sourceInfo = scriptContext->AddHostSrcInfo(&si);
        }
    }